

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

void __thiscall soul::TokenisedPathString::~TokenisedPathString(TokenisedPathString *this)

{
  Section *pSVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->sections).numActive = 0;
  if (8 < (this->sections).numAllocated) {
    pSVar1 = (this->sections).items;
    if (pSVar1 != (Section *)0x0) {
      operator_delete__(pSVar1);
    }
    (this->sections).items = (Section *)(this->sections).space;
    (this->sections).numAllocated = 8;
  }
  pcVar2 = (this->fullPath)._M_dataplus._M_p;
  paVar3 = &(this->fullPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TokenisedPathString (std::string path) : fullPath (std::move (path))
    {
        size_t currentSectionStart = 0;
        auto length = fullPath.length();

        while (currentSectionStart < length)
        {
            auto nextBreak = fullPath.find ("::", currentSectionStart);
            SOUL_ASSERT (nextBreak != 0);

            if (nextBreak == std::string::npos)
            {
                sections.push_back ({ currentSectionStart, length });
                break;
            }

            sections.push_back ({ currentSectionStart, nextBreak });
            currentSectionStart = nextBreak + 2;
        }
    }